

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  cJSON *pcVar8;
  
  if (name != (char *)0x0 && object != (cJSON *)0x0) {
    pcVar8 = object->child;
    if (case_sensitive == 0) {
      if (pcVar8 != (cJSON *)0x0) {
        do {
          pbVar3 = (byte *)pcVar8->string;
          if (pbVar3 != (byte *)0x0) {
            if (pbVar3 == (byte *)name) {
              return pcVar8;
            }
            bVar1 = *name;
            uVar5 = bVar1 + 0x20;
            if (0x19 < bVar1 - 0x41) {
              uVar5 = (uint)bVar1;
            }
            bVar2 = *pbVar3;
            uVar7 = bVar2 + 0x20;
            if (0x19 < bVar2 - 0x41) {
              uVar7 = (uint)bVar2;
            }
            if (uVar5 == uVar7) {
              lVar6 = 1;
              do {
                if (bVar1 == 0) {
                  return pcVar8;
                }
                bVar1 = name[lVar6];
                uVar5 = bVar1 + 0x20;
                if (0x19 < bVar1 - 0x41) {
                  uVar5 = (uint)bVar1;
                }
                bVar2 = pbVar3[lVar6];
                uVar7 = bVar2 + 0x20;
                if (0x19 < bVar2 - 0x41) {
                  uVar7 = (uint)bVar2;
                }
                lVar6 = lVar6 + 1;
              } while (uVar5 == uVar7);
            }
            if (uVar5 == uVar7) {
              return pcVar8;
            }
          }
          pcVar8 = pcVar8->next;
          if (pcVar8 == (cJSON *)0x0) {
            return (cJSON *)0x0;
          }
        } while( true );
      }
    }
    else if (pcVar8 != (cJSON *)0x0) {
      do {
        iVar4 = strcmp(name,pcVar8->string);
        if (iVar4 == 0) {
          return pcVar8;
        }
        pcVar8 = pcVar8->next;
      } while (pcVar8 != (cJSON *)0x0);
      return (cJSON *)0x0;
    }
  }
  return (cJSON *)0x0;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
	while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    return current_element;
}